

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trap.c
# Opt level: O3

_Bool square_remove_all_traps_of_type(chunk *c,loc grid,wchar_t t_idx_remove)

{
  trap *trap;
  bool bVar1;
  _Bool _Var2;
  square *psVar3;
  trap *ptVar4;
  trap *p;
  
  psVar3 = square((chunk_conflict *)c,grid);
  if (psVar3->trap != (trap *)0x0) {
    bVar1 = false;
    ptVar4 = (trap *)0x0;
    p = psVar3->trap;
    do {
      trap = p->next;
      if ((uint)p->t_idx == t_idx_remove) {
        mem_free(p);
        if (ptVar4 == (trap *)0x0) {
          square_set_trap((chunk_conflict *)c,grid,trap);
          if (trap == (trap *)0x0) {
            psVar3 = square((chunk_conflict *)c,grid);
            flag_off(psVar3->info,3,9);
            goto LAB_001d1c3f;
          }
          bVar1 = true;
          p = (trap *)0x0;
        }
        else {
          ptVar4->next = trap;
          bVar1 = true;
          p = ptVar4;
        }
      }
      ptVar4 = p;
      p = trap;
    } while (trap != (trap *)0x0);
    if (bVar1) {
LAB_001d1c3f:
      _Var2 = square_isseen((chunk_conflict *)c,grid);
      if (!_Var2) {
        return true;
      }
      square_memorize_traps(c,grid);
      square_light_spot(c,grid);
      return true;
    }
  }
  return false;
}

Assistant:

bool square_remove_all_traps_of_type(struct chunk *c, struct loc grid,
		int t_idx_remove)
{
	bool removed = false;

	/* Look at the traps in this grid */
	struct trap *prev_trap = NULL;
	struct trap *trap = square(c, grid)->trap;

	while (trap) {
		struct trap *next_trap = trap->next;

		if (t_idx_remove == trap->t_idx) {
			mem_free(trap);
			removed = true;

			if (prev_trap) {
				prev_trap->next = next_trap;
			} else {
				square_set_trap(c, grid, next_trap);
				if (!next_trap) {
					sqinfo_off(square(c, grid)->info,
						SQUARE_TRAP);
				}
			}
		} else {
			prev_trap = trap;
		}

		trap = next_trap;
	}

	/* Refresh grids that the character can see */
	if (removed && square_isseen(c, grid)) {
		square_memorize_traps(c, grid);
		square_light_spot(c, grid);
	}

	return removed;
}